

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O1

SynAlign * ParseAlign(ParseContext *ctx)

{
  Lexeme *begin;
  bool bVar1;
  int iVar2;
  SynNumber *this;
  SynAlign *this_00;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Lexeme *pLVar3;
  undefined4 extraout_var;
  
  begin = ctx->currentLexeme;
  if (begin->type == lex_align) {
    ctx->currentLexeme = begin + 1;
    anon_unknown.dwarf_16d1cf::CheckConsume(ctx,lex_oparen,"ERROR: \'(\' expected after align");
    bVar1 = anon_unknown.dwarf_16d1cf::CheckAt
                      (ctx,lex_number,"ERROR: alignment value not found after align(");
    if (bVar1) {
      this = ParseNumber(ctx);
    }
    else {
      iVar2 = (*ctx->allocator->_vptr_Allocator[2])();
      this = (SynNumber *)CONCAT44(extraout_var_00,iVar2);
      SynBase::SynBase((SynBase *)this,0,ctx->currentLexeme,ctx->currentLexeme);
      (this->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_003f6d38;
    }
    anon_unknown.dwarf_16d1cf::CheckConsume
              (ctx,lex_cparen,"ERROR: \')\' expected after alignment value");
    iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
    this_00 = (SynAlign *)CONCAT44(extraout_var_01,iVar2);
    pLVar3 = ctx->currentLexeme;
    if (pLVar3 <= ctx->firstLexeme) {
LAB_00221078:
      __assert_fail("currentLexeme > firstLexeme",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ParseTree.cpp"
                    ,0x19c,"Lexeme *ParseContext::Previous()");
    }
  }
  else {
    if (ctx->currentLexeme->type != lex_noalign) {
      return (SynAlign *)0x0;
    }
    ctx->currentLexeme = ctx->currentLexeme + 1;
    iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
    this_00 = (SynAlign *)CONCAT44(extraout_var,iVar2);
    pLVar3 = ctx->currentLexeme;
    if (pLVar3 <= ctx->firstLexeme) goto LAB_00221078;
    this = (SynNumber *)0x0;
  }
  SynBase::SynBase(&this_00->super_SynBase,0x15,begin,pLVar3 + -1);
  (this_00->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_003f7888;
  this_00->value = &this->super_SynBase;
  return this_00;
}

Assistant:

SynAlign* ParseAlign(ParseContext &ctx)
{
	Lexeme *start = ctx.currentLexeme;

	if(ctx.Consume(lex_align))
	{
		CheckConsume(ctx, lex_oparen, "ERROR: '(' expected after align");

		SynBase *value = NULL;

		if(CheckAt(ctx, lex_number, "ERROR: alignment value not found after align("))
			value = ParseNumber(ctx);
		else
			value = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());

		CheckConsume(ctx, lex_cparen, "ERROR: ')' expected after alignment value");

		return new (ctx.get<SynAlign>()) SynAlign(start, ctx.Previous(), value);
	}
	else if(ctx.Consume(lex_noalign))
	{
		return new (ctx.get<SynAlign>()) SynAlign(start, ctx.Previous(), NULL);
	}

	return NULL;
}